

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcc_expr.cpp
# Opt level: O0

void __thiscall FreeOpInfoProtos::~FreeOpInfoProtos(FreeOpInfoProtos *this)

{
  ulong local_18;
  size_t i;
  FreeOpInfoProtos *this_local;
  
  for (local_18 = 0; local_18 < 0x3e; local_18 = local_18 + 1) {
    ZCC_OpInfoType::FreeAllProtos(ZCC_OpInfo + local_18);
  }
  return;
}

Assistant:

~FreeOpInfoProtos()
	{
		for (size_t i = 0; i < countof(ZCC_OpInfo); ++i)
		{
			ZCC_OpInfo[i].FreeAllProtos();
		}
	}